

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_use_includes
          (t_perl_generator *this,ostream *os,bool *done,t_type *type,bool selfish)

{
  t_program *p;
  pointer pptVar1;
  pointer pptVar2;
  t_program *p_00;
  ostream *poVar3;
  reference pptVar4;
  size_type i;
  size_type __n;
  string local_50;
  
  p = type->program_;
  if ((p != (t_program *)0x0) && (*done == false)) {
    pptVar1 = (p->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pptVar2 = (p->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (selfish) {
      poVar3 = std::operator<<(os,"use ");
      perl_namespace_abi_cxx11_(&local_50,this,p);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      poVar3 = std::operator<<(poVar3,"Types;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
    }
    for (__n = 0; (long)pptVar1 - (long)pptVar2 >> 3 != __n; __n = __n + 1) {
      pptVar4 = std::vector<t_program_*,_std::allocator<t_program_*>_>::at(&p->includes_,__n);
      p_00 = *pptVar4;
      poVar3 = std::operator<<(os,"use ");
      perl_namespace_abi_cxx11_(&local_50,this,p_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      poVar3 = std::operator<<(poVar3,"Types;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator<<(os,(string *)&::endl_abi_cxx11_);
    *done = true;
  }
  return;
}

Assistant:

void t_perl_generator::generate_use_includes(std::ostream& os, bool& done, t_type *type, bool selfish) {
  t_program *current = type->get_program();
  if (current && !done) {
    std::vector<t_program*>& currInc = current->get_includes();
    std::vector<t_program*>::size_type numInc = currInc.size();
    if (selfish) {
      os << "use " << perl_namespace(current) << "Types;" << endl;
    }
    for (std::vector<t_program*>::size_type i = 0; i < numInc; ++i) {
      t_program* incProgram = currInc.at(i);
      os << "use " << perl_namespace(incProgram) << "Types;" << endl;
    }
    os << endl;
    done = true;
  }
}